

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

bool __thiscall ThreadContext::AsyncHostOperationStart(ThreadContext *this,void *suspendRecord)

{
  ScriptEntryExitRecord *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptEntryExitRecord *lastRecord;
  bool wasInAsync;
  void *suspendRecord_local;
  ThreadContext *this_local;
  
  lastRecord._7_1_ = false;
  bVar3 = IsScriptActive(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xfd1,"(!this->IsScriptActive())","!this->IsScriptActive()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar1 = this->entryExitRecord;
  if (pSVar1 != (ScriptEntryExitRecord *)0x0) {
    if ((*(byte *)pSVar1 >> 3 & 1) == 0) {
      lastRecord._7_1_ = (bool)(*(byte *)pSVar1 >> 4 & 1);
      *(byte *)pSVar1 = *(byte *)pSVar1 & 0xef | 0x10;
      Js::ScriptContext::ProfileSuspend
                (pSVar1->scriptContext,RunPhase,(SuspendRecord *)suspendRecord);
    }
    else if ((*(byte *)pSVar1 >> 4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xfe1,"(!lastRecord->leaveForAsyncHostOperation)",
                         "!lastRecord->leaveForAsyncHostOperation");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return lastRecord._7_1_;
}

Assistant:

bool
ThreadContext::AsyncHostOperationStart(void * suspendRecord)
{
    bool wasInAsync = false;
    Assert(!this->IsScriptActive());
    Js::ScriptEntryExitRecord * lastRecord = this->entryExitRecord;
    if (lastRecord != NULL)
    {
        if (!lastRecord->leaveForHost)
        {
#if DBG
            wasInAsync = !!lastRecord->leaveForAsyncHostOperation;
            lastRecord->leaveForAsyncHostOperation = true;
#endif
#ifdef PROFILE_EXEC
            lastRecord->scriptContext->ProfileSuspend(Js::RunPhase, (Js::Profiler::SuspendRecord *)suspendRecord);
#endif
        }
        else
        {
            Assert(!lastRecord->leaveForAsyncHostOperation);
        }
    }
    return wasInAsync;
}